

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O0

bool __thiscall ON_Workspace::KeepFile(ON_Workspace *this,FILE *pFile)

{
  ON_Workspace_FBLK *local_28;
  ON_Workspace_FBLK *pFileBlk;
  bool rc;
  FILE *pFile_local;
  ON_Workspace *this_local;
  
  if (pFile != (FILE *)0x0) {
    for (local_28 = this->m_pFileBlk; local_28 != (ON_Workspace_FBLK *)0x0;
        local_28 = local_28->pNext) {
      if (local_28->pFile == pFile) {
        local_28->pFile = (FILE *)0x0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Workspace::KeepFile( FILE* pFile )
{
  bool rc = false;
  if ( pFile ) {
    struct ON_Workspace_FBLK* pFileBlk = m_pFileBlk;
    while ( pFileBlk ) {
      if ( pFileBlk->pFile == pFile ) {
        pFileBlk->pFile = nullptr;
        rc = true;
        break;
      }
      pFileBlk = pFileBlk->pNext;
    }
  }
  return rc;
}